

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serializer.hpp
# Opt level: O0

long __thiscall
tf::Serializer<std::ofstream,long>::operator()
          (Serializer<std::basic_ofstream<char,_std::char_traits<char>_>,_long> *this,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *items,TaskType *items_1
          ,time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
           *items_2,
          time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
          *items_3)

{
  Serializer<std::basic_ofstream<char,_std::char_traits<char>_>,_long> *this_00;
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  *t;
  long lVar1;
  long lVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDX;
  Serializer<std::basic_ofstream<char,_std::char_traits<char>_>,_long> *in_RSI;
  TaskType *in_RDI;
  Serializer<std::basic_ofstream<char,_std::char_traits<char>_>,_long> *in_stack_ffffffffffffffc0;
  
  this_00 = (Serializer<std::basic_ofstream<char,_std::char_traits<char>_>,_long> *)
            Serializer<std::basic_ofstream<char,_std::char_traits<char>_>,_long>::
            _save<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_nullptr>
                      (in_RSI,in_RDX);
  t = (time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
       *)Serializer<std::basic_ofstream<char,_std::char_traits<char>_>,_long>::
         _save<const_tf::TaskType_&,_nullptr>(in_stack_ffffffffffffffc0,in_RDI);
  lVar1 = Serializer<std::basic_ofstream<char,_std::char_traits<char>_>,_long>::
          _save<const_std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_&,_nullptr>
                    (this_00,t);
  lVar2 = Serializer<std::basic_ofstream<char,_std::char_traits<char>_>,_long>::
          _save<const_std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_&,_nullptr>
                    (this_00,t);
  return (long)&this_00->_stream + (long)&(t->__d).__r + lVar1 + lVar2;
}

Assistant:

SizeType Serializer<Stream, SizeType>::operator() (T&&... items) {
  return (_save(std::forward<T>(items)) + ...);
}